

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3Fts5Mprintf(int *pRc,char *zFmt,...)

{
  long lVar1;
  int *in_RDI;
  long in_FS_OFFSET;
  char *zRet;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (char *)0x0;
  if ((*in_RDI == 0) &&
     (local_40 = sqlite3_vmprintf(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08),
     local_40 == (char *)0x0)) {
    *in_RDI = 7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

static char *sqlite3Fts5Mprintf(int *pRc, const char *zFmt, ...){
  char *zRet = 0;
  if( *pRc==SQLITE_OK ){
    va_list ap;
    va_start(ap, zFmt);
    zRet = sqlite3_vmprintf(zFmt, ap);
    va_end(ap);
    if( zRet==0 ){
      *pRc = SQLITE_NOMEM;
    }
  }
  return zRet;
}